

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O0

bool Function_Template::form4_ProjectionProfile(ProjectionProfileForm4 ProjectionProfile)

{
  anon_class_8_1_a8c68091 __pred;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __first;
  int iVar1;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __last;
  code *in_RDI;
  uint32_t value;
  vector<unsigned_int,_std::allocator<unsigned_int>_> projection;
  bool horizontal;
  uint32_t roiHeight;
  uint32_t roiWidth;
  uint32_t roiY;
  uint32_t roiX;
  Image image;
  uint8_t intensity;
  uint32_t *in_stack_fffffffffffffef8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this;
  undefined6 in_stack_ffffffffffffff00;
  uint8_t in_stack_ffffffffffffff06;
  uint8_t in_stack_ffffffffffffff07;
  uint32_t *in_stack_ffffffffffffff08;
  undefined2 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff12;
  undefined1 in_stack_ffffffffffffff13;
  byte bVar2;
  undefined4 in_stack_ffffffffffffff14;
  Image *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  uint32_t in_stack_ffffffffffffff24;
  uint uVar3;
  undefined8 in_stack_ffffffffffffff28;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_98;
  byte local_7d;
  uint local_7c;
  uint local_78;
  undefined4 local_74;
  undefined4 local_70;
  undefined1 local_38 [47];
  uint8_t local_9;
  code *local_8;
  
  local_8 = in_RDI;
  local_9 = Unit_Test::intensityValue();
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            ((ImageTemplate<unsigned_char> *)
             CONCAT44(in_stack_ffffffffffffff14,
                      CONCAT13(in_stack_ffffffffffffff13,
                               CONCAT12(in_stack_ffffffffffffff12,in_stack_ffffffffffffff10))),
             (uint32_t)((ulong)in_stack_ffffffffffffff08 >> 0x20),
             (uint32_t)in_stack_ffffffffffffff08,in_stack_ffffffffffffff07,in_stack_ffffffffffffff06
            );
  Test_Helper::uniformImage
            ((uint8_t)((ulong)in_stack_ffffffffffffff28 >> 0x38),(uint32_t)in_stack_ffffffffffffff28
             ,in_stack_ffffffffffffff24,in_stack_ffffffffffffff18);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1dedf5);
  Unit_Test::generateRoi
            ((Image *)CONCAT44(in_stack_ffffffffffffff14,
                               CONCAT13(in_stack_ffffffffffffff13,
                                        CONCAT12(in_stack_ffffffffffffff12,in_stack_ffffffffffffff10
                                                ))),in_stack_ffffffffffffff08,
             (uint32_t *)
             CONCAT17(in_stack_ffffffffffffff07,
                      CONCAT16(in_stack_ffffffffffffff06,in_stack_ffffffffffffff00)),
             in_stack_fffffffffffffef8,(uint32_t *)0x1dee22);
  iVar1 = Test_Helper::randomValue<int>(0x1dee2e);
  local_7d = iVar1 == 0;
  this = &local_98;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x1dee51);
  (*local_8)(local_38,local_70,local_74,local_78,local_7c,local_7d & 1);
  uVar3 = local_78;
  if ((local_7d & 1) != 0) {
    uVar3 = local_7c;
  }
  __last._M_current =
       (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&local_98);
  if ((local_7d & 1) != 0) {
    local_7c = local_78;
  }
  bVar2 = false;
  if (__last._M_current == (uint *)(ulong)local_7c) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(this);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(this);
    __first._M_current._4_4_ = uVar3;
    __first._M_current._0_4_ = in_stack_ffffffffffffff20;
    __pred.value._2_1_ = in_stack_ffffffffffffff12;
    __pred.value._0_2_ = in_stack_ffffffffffffff10;
    __pred.value._3_1_ = bVar2;
    __pred.value._4_4_ = local_7c;
    in_stack_ffffffffffffff12 =
         std::
         all_of<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,Function_Template::form4_ProjectionProfile(void(*)(PenguinV_Image::ImageTemplate<unsigned_char>const&,unsigned_int,unsigned_int,unsigned_int,unsigned_int,bool,std::vector<unsigned_int,std::allocator<unsigned_int>>&))::__0>
                   (__first,__last,__pred);
    bVar2 = in_stack_ffffffffffffff12;
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(local_7c,CONCAT13(bVar2,CONCAT12(in_stack_ffffffffffffff12,
                                                       in_stack_ffffffffffffff10))));
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1def88);
  return (bool)(bVar2 & 1);
}

Assistant:

bool form4_ProjectionProfile(ProjectionProfileForm4 ProjectionProfile)
    {
        const uint8_t intensity = intensityValue();
        const PenguinV_Image::Image image = uniformImage( intensity );

        uint32_t roiX, roiY, roiWidth, roiHeight;
        generateRoi( image, roiX, roiY, roiWidth, roiHeight );

        const bool horizontal = (randomValue<int>(2) == 0);

        std::vector < uint32_t > projection;
        ProjectionProfile( image, roiX, roiY, roiWidth, roiHeight, horizontal, projection );

        const uint32_t value = (horizontal ? roiHeight : roiWidth) * intensity;

        return projection.size() == (horizontal ? roiWidth : roiHeight) &&
            std::all_of( projection.begin(), projection.end(), [&value]( uint32_t v ) { return value == v; } );
    }